

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O3

void __thiscall Fl_Widget::copy_tooltip(Fl_Widget *this,char *text)

{
  char *pcVar1;
  
  if (Fl_Tooltip::set_enter_exit_once_()::beenhere == '\0') {
    Fl_Tooltip::set_enter_exit_once_()::beenhere = '\x01';
    Fl_Tooltip::enter = Fl_Tooltip::enter_;
    Fl_Tooltip::exit = Fl_Tooltip::exit_;
  }
  if ((this->flags_ & 0x20000) != 0) {
    free(this->tooltip_);
  }
  if (text == (char *)0x0) {
    this->flags_ = this->flags_ & 0xfffdffff;
    pcVar1 = (char *)0x0;
  }
  else {
    this->flags_ = this->flags_ | 0x20000;
    pcVar1 = strdup(text);
  }
  this->tooltip_ = pcVar1;
  return;
}

Assistant:

void Fl_Widget::copy_tooltip(const char *text) {
  Fl_Tooltip::set_enter_exit_once_();
  if (flags() & COPIED_TOOLTIP) free((void *)(tooltip_));
  if (text) {
    set_flag(COPIED_TOOLTIP);
    tooltip_ = strdup(text);
  } else {
    clear_flag(COPIED_TOOLTIP);
    tooltip_ = (char *)0;
  }
}